

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_strutils.cpp
# Opt level: O0

bool crnlib::string_to_float(char **p,float *value,uint round_digit)

{
  bool bVar1;
  double local_30;
  double d;
  float *pfStack_20;
  uint round_digit_local;
  float *value_local;
  char **p_local;
  
  d._4_4_ = round_digit;
  pfStack_20 = value;
  value_local = (float *)p;
  bVar1 = string_to_double(p,&local_30,round_digit);
  if (bVar1) {
    *pfStack_20 = (float)local_30;
  }
  else {
    *pfStack_20 = 0.0;
  }
  return bVar1;
}

Assistant:

bool string_to_float(const char*& p, float& value, uint round_digit)
    {
        double d;
        if (!string_to_double(p, d, round_digit))
        {
            value = 0;
            return false;
        }
        value = static_cast<float>(d);
        return true;
    }